

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_do_button_text(nk_flags *state,nk_command_buffer *out,nk_rect bounds,char *string,int len,
                     nk_flags align,nk_button_behavior behavior,nk_style_button *style,nk_input *in,
                     nk_user_font *font)

{
  uint state_00;
  int iVar1;
  nk_style_item *pnVar2;
  nk_color *pnVar3;
  nk_text local_60;
  nk_rect local_50;
  nk_rect local_40;
  
  local_40 = bounds;
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4ca6,
                  "int nk_do_button_text(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (style == (nk_style_button *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4ca7,
                  "int nk_do_button_text(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4ca8,
                  "int nk_do_button_text(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (string == (char *)0x0) {
    __assert_fail("string",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4ca9,
                  "int nk_do_button_text(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4caa,
                  "int nk_do_button_text(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  iVar1 = nk_do_button(state,out,bounds,style,in,behavior,&local_50);
  if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
  }
  state_00 = *state;
  pnVar2 = nk_draw_button(out,&local_40,state_00,style);
  pnVar3 = &style->text_background;
  if (pnVar2->type == NK_STYLE_ITEM_COLOR) {
    pnVar3 = (nk_color *)&pnVar2->data;
  }
  local_60.background = *pnVar3;
  if ((state_00 & 0x10) == 0) {
    if ((state_00 & 0x20) == 0) {
      local_60.text = style->text_normal;
    }
    else {
      local_60.text = style->text_active;
    }
  }
  else {
    local_60.text = style->text_hover;
  }
  local_60.padding.x = 0.0;
  local_60.padding.y = 0.0;
  nk_widget_text(out,local_50,string,len,&local_60,align,font);
  if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
  }
  return iVar1;
}

Assistant:

NK_LIB int
nk_do_button_text(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect bounds,
    const char *string, int len, nk_flags align, enum nk_button_behavior behavior,
    const struct nk_style_button *style, const struct nk_input *in,
    const struct nk_user_font *font)
{
    struct nk_rect content;
    int ret = nk_false;

    NK_ASSERT(state);
    NK_ASSERT(style);
    NK_ASSERT(out);
    NK_ASSERT(string);
    NK_ASSERT(font);
    if (!out || !style || !font || !string)
        return nk_false;

    ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_button_text(out, &bounds, &content, *state, style, string, len, align, font);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return ret;
}